

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Node::key_t::key_t(key_t *this)

{
  char *__end;
  
  this->c = 0;
  (this->o)._M_dataplus._M_p = (pointer)&(this->o).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->o,"0","");
  this->t = 0;
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->d,"0","");
  return;
}

Assistant:

Node::key_t::key_t():c(0),o("0"),t(0),d("0"){}